

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_clrsb_i64_x86_64(TCGContext *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg)

{
  TCGv_i64 ret_00;
  TCGv_i64 t;
  TCGv_i64 arg_local;
  TCGv_i64 ret_local;
  TCGContext *tcg_ctx_local;
  
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_sari_i64_x86_64(tcg_ctx,ret_00,arg,0x3f);
  tcg_gen_xor_i64_x86_64(tcg_ctx,ret_00,ret_00,arg);
  tcg_gen_clzi_i64_x86_64(tcg_ctx,ret_00,ret_00,0x40);
  tcg_gen_subi_i64_x86_64(tcg_ctx,ret,ret_00,1);
  tcg_temp_free_i64(tcg_ctx,ret_00);
  return;
}

Assistant:

void tcg_gen_clrsb_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg)
{
#if TCG_TARGET_HAS_clz_i64 || TCG_TARGET_HAS_clz_i32
        TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_sari_i64(tcg_ctx, t, arg, 63);
        tcg_gen_xor_i64(tcg_ctx, t, t, arg);
        tcg_gen_clzi_i64(tcg_ctx, t, t, 64);
        tcg_gen_subi_i64(tcg_ctx, ret, t, 1);
        tcg_temp_free_i64(tcg_ctx, t);
#else
        gen_helper_clrsb_i64(tcg_ctx, ret, arg);
#endif
}